

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::read_crn_from_memory
          (mipmapped_texture *this,void *pData,uint data_size,char *pFilename)

{
  element *p;
  bool bVar1;
  int iVar2;
  mip_level *pmVar3;
  crnd_unpack_context pContext;
  dxt_image *this_00;
  vector<crnlib::mip_level_*> *pvVar4;
  uint32 uVar5;
  void *pvVar6;
  vector<crnlib::mip_level_*> *pvVar7;
  uint uVar8;
  uint uVar9;
  dynamic_string *this_01;
  ulong uVar10;
  long lVar11;
  char *p_00;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  face_vec faces;
  vector<unsigned_char> dxt_data;
  void *pFaces [6];
  uint local_fc;
  face_vec local_f8;
  void *local_e0;
  elemental_vector local_d8;
  mipmapped_texture *local_c8;
  crn_texture_info local_c0;
  pixel_format local_94;
  crnd_unpack_context local_90;
  dynamic_string *local_88;
  char *local_80;
  dynamic_string local_78;
  void *local_68 [7];
  
  local_80 = pFilename;
  clear(this);
  this_01 = &this->m_last_error;
  local_c8 = this;
  dynamic_string::set(this_01,"Image file load failed",0xffffffff);
  if (data_size == 0 || pData == (void *)0x0) {
    return false;
  }
  local_c0.m_struct_size = 0x28;
  bVar1 = crnd::crnd_get_texture_info(pData,data_size,&local_c0);
  if (!bVar1) {
    p_00 = "crnd_get_texture_info() failed";
LAB_00134f45:
    dynamic_string::set(this_01,p_00,0xffffffff);
    return false;
  }
  local_94 = crnd::crnd_crn_format_to_fourcc(local_c0.m_format);
  uVar5 = local_c0.m_faces;
  local_88 = this_01;
  if ((int)local_94 < 0x35545844) {
    if ((int)local_94 < 0x32435445) {
      if ((int)local_94 < 0x31495441) {
        if (local_94 == PIXEL_FMT_INVALID) {
          p_00 = "Unsupported DXT format";
          goto LAB_00134f45;
        }
        if (local_94 == PIXEL_FMT_ETC1) {
          local_fc = 7;
          goto LAB_001350c4;
        }
      }
      else {
        if (local_94 == PIXEL_FMT_DXT5A) {
          local_fc = 4;
          goto LAB_001350c4;
        }
        local_fc = 0;
        if (local_94 == PIXEL_FMT_DXT1) goto LAB_001350c4;
      }
    }
    else if ((int)local_94 < 0x32545844) {
      if (local_94 == PIXEL_FMT_ETC2) {
        local_fc = 8;
        goto LAB_001350c4;
      }
      if (local_94 == PIXEL_FMT_3DC) {
        local_fc = 6;
        goto LAB_001350c4;
      }
    }
    else {
      if ((local_94 == PIXEL_FMT_DXT2) || (local_94 == PIXEL_FMT_DXT3)) {
        local_fc = 2;
        goto LAB_001350c4;
      }
      if (local_94 == PIXEL_FMT_DXT4) goto LAB_0013506a;
    }
LAB_001350bc:
    local_fc = 0xffffffff;
  }
  else {
    if ((int)local_94 < 0x52784778) {
      if ((int)local_94 < 0x41325445) {
        if (local_94 != PIXEL_FMT_DXT5) {
          if (local_94 == PIXEL_FMT_DXT1A) {
            local_fc = 1;
            goto LAB_001350c4;
          }
          goto LAB_001350bc;
        }
      }
      else {
        if (local_94 == PIXEL_FMT_ETC2A) {
          local_fc = 9;
          goto LAB_001350c4;
        }
        if ((local_94 != PIXEL_FMT_DXT5_AGBR) && (local_94 != PIXEL_FMT_DXT5_xGBR))
        goto LAB_001350bc;
      }
    }
    else if ((int)local_94 < 0x53413245) {
      if (local_94 != PIXEL_FMT_DXT5_xGxR) {
        if (local_94 == PIXEL_FMT_ETC1S) {
          local_fc = 10;
          goto LAB_001350c4;
        }
        goto LAB_001350bc;
      }
    }
    else {
      if (local_94 == PIXEL_FMT_ETC2AS) {
        local_fc = 0xb;
        goto LAB_001350c4;
      }
      if (local_94 == PIXEL_FMT_DXN) {
        local_fc = 5;
        goto LAB_001350c4;
      }
      if (local_94 != PIXEL_FMT_DXT5_CCxY) goto LAB_001350bc;
    }
LAB_0013506a:
    local_fc = 3;
  }
LAB_001350c4:
  local_f8.m_p = (vector<crnlib::mip_level_*> *)0x0;
  local_f8.m_size = 0;
  local_f8.m_capacity = 0;
  if (local_c0.m_faces == 0) {
    uVar9 = 0;
  }
  else {
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_f8,local_c0.m_faces,local_c0.m_faces == 1,0x10,
               (object_mover)0x0,false);
    if (uVar5 != local_f8.m_size) {
      memset(local_f8.m_p + (local_f8._8_8_ & 0xffffffff),0,(ulong)(uVar5 - local_f8.m_size) << 4);
    }
    local_f8.m_size = uVar5;
    uVar9 = 0;
    if (local_c0.m_faces != 0) {
      uVar12 = (ulong)local_c0.m_levels;
      uVar14 = 0;
      uVar5 = local_c0.m_levels;
      local_e0 = pData;
      do {
        uVar9 = local_f8.m_p[uVar14].m_size;
        pvVar7 = local_f8.m_p + uVar14;
        if (uVar9 != uVar5) {
          if (uVar9 <= uVar5) {
            if (pvVar7->m_capacity < uVar5) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)pvVar7,uVar5,uVar9 + 1 == uVar5,8,(object_mover)0x0,
                         false);
              uVar9 = pvVar7->m_size;
            }
            memset(pvVar7->m_p + uVar9,0,(ulong)(uVar5 - uVar9) << 3);
            uVar12 = (ulong)local_c0.m_levels;
          }
          pvVar7->m_size = uVar5;
          uVar5 = (uint32)uVar12;
        }
        if (uVar5 == 0) {
          uVar5 = 0;
        }
        else {
          uVar10 = 0;
          do {
            pmVar3 = (mip_level *)crnlib_malloc(0x28);
            pmVar3->m_width = 0;
            pmVar3->m_height = 0;
            pmVar3->m_comp_flags = cDefaultCompFlags;
            *(undefined8 *)&pmVar3->m_format = 0;
            *(undefined8 *)((long)&pmVar3->m_pImage + 4) = 0;
            *(undefined8 *)((long)&pmVar3->m_pDXTImage + 4) = 0;
            local_f8.m_p[uVar14].m_p[uVar10] = pmVar3;
            uVar10 = uVar10 + 1;
            uVar12 = (ulong)local_c0.m_levels;
            uVar5 = local_c0.m_levels;
          } while (uVar10 < uVar12);
        }
        uVar14 = uVar14 + 1;
        pData = local_e0;
        uVar9 = local_c0.m_faces;
      } while (uVar14 < local_c0.m_faces);
    }
  }
  local_d8.m_p = (void *)0x0;
  local_d8.m_size = 0;
  local_d8.m_capacity = 0;
  uVar8 = (local_c0.m_height + 3 >> 2) * (local_c0.m_width + 3 >> 2) * uVar9 *
          local_c0.m_bytes_per_block;
  if (uVar8 != 0) {
    elemental_vector::increase_capacity(&local_d8,uVar8,uVar8 == 1,1,(object_mover)0x0,false);
    memset((void *)((local_d8._8_8_ & 0xffffffff) + (long)local_d8.m_p),0,
           (ulong)(uVar8 - local_d8.m_size));
    local_d8.m_size = uVar8;
  }
  dynamic_string::set(local_88,"CRN unpack failed",0xffffffff);
  pContext = crnd::crnd_unpack_begin(pData,data_size);
  if (pContext == (crnd_unpack_context)0x0) {
    if (local_f8.m_size != 0) {
      uVar12 = 0;
      pvVar4 = local_f8.m_p;
      pvVar7 = local_f8.m_p;
      uVar8 = local_f8.m_size;
      do {
        if (pvVar7[uVar12].m_size != 0) {
          uVar14 = 0;
          do {
            pmVar3 = pvVar7[uVar12].m_p[uVar14];
            if (pmVar3 != (mip_level *)0x0) {
              mip_level::~mip_level(pmVar3);
              crnlib_free(pmVar3);
              pvVar4 = local_f8.m_p;
            }
            uVar14 = uVar14 + 1;
            pvVar7 = pvVar4;
          } while (uVar14 < pvVar4[uVar12].m_size);
          uVar8 = local_f8.m_size;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar8);
    }
LAB_0013558f:
    bVar1 = false;
  }
  else {
    uVar12 = (ulong)local_c0.m_faces;
    if (uVar12 < 6) {
      memset(local_68 + uVar12,0,(ulong)(local_c0.m_faces * -8 + 0x28) + 8);
    }
    if (local_c0.m_levels != 0) {
      pvVar6 = (void *)0x0;
      local_90 = pContext;
      do {
        uVar9 = local_c0.m_width >> ((byte)pvVar6 & 0x1f);
        uVar13 = local_c0.m_height >> ((byte)pvVar6 & 0x1f);
        uVar5 = local_c0.m_bytes_per_block * (uVar9 + (uVar9 == 0) + 3 >> 2);
        if ((int)uVar12 != 0) {
          uVar9 = 0;
          uVar14 = 0;
          do {
            local_68[uVar14] = (void *)((ulong)uVar9 + (long)local_d8.m_p);
            uVar14 = uVar14 + 1;
            uVar9 = uVar9 + uVar5 * (uVar13 + (uVar13 == 0) + 3 >> 2);
          } while (uVar12 != uVar14);
        }
        local_e0 = pvVar6;
        bVar1 = crnd::crnd_unpack_level(pContext,local_68,local_d8.m_size,uVar5,(uint32)pvVar6);
        if (!bVar1) {
          crnd::crnd_unpack_end(pContext);
          if (local_f8.m_size != 0) {
            uVar12 = 0;
            pvVar4 = local_f8.m_p;
            pvVar7 = local_f8.m_p;
            uVar8 = local_f8.m_size;
            do {
              if (pvVar7[uVar12].m_size != 0) {
                uVar14 = 0;
                do {
                  pmVar3 = pvVar7[uVar12].m_p[uVar14];
                  if (pmVar3 != (mip_level *)0x0) {
                    mip_level::~mip_level(pmVar3);
                    crnlib_free(pmVar3);
                    pvVar4 = local_f8.m_p;
                  }
                  uVar14 = uVar14 + 1;
                  pvVar7 = pvVar4;
                } while (uVar14 < pvVar4[uVar12].m_size);
                uVar8 = local_f8.m_size;
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < uVar8);
          }
          goto LAB_0013558f;
        }
        if (local_c0.m_faces == 0) {
          uVar12 = 0;
        }
        else {
          lVar11 = 0;
          uVar14 = 0;
          do {
            this_00 = (dxt_image *)crnlib_malloc(0x48);
            dxt_image::dxt_image(this_00);
            iVar2 = dxt_image::init(this_00,(EVP_PKEY_CTX *)(ulong)local_fc);
            if ((char)iVar2 == '\0') {
              p = (this_00->m_elements).m_p;
              if (p != (element *)0x0) {
                crnlib_free(p);
              }
              crnlib_free(this_00);
              crnd::crnd_unpack_end(local_90);
              if (local_f8.m_size != 0) {
                uVar12 = 0;
                pvVar4 = local_f8.m_p;
                pvVar7 = local_f8.m_p;
                uVar8 = local_f8.m_size;
                do {
                  if (pvVar7[uVar12].m_size != 0) {
                    uVar14 = 0;
                    do {
                      pmVar3 = pvVar7[uVar12].m_p[uVar14];
                      if (pmVar3 != (mip_level *)0x0) {
                        mip_level::~mip_level(pmVar3);
                        crnlib_free(pmVar3);
                        pvVar4 = local_f8.m_p;
                      }
                      uVar14 = uVar14 + 1;
                      pvVar7 = pvVar4;
                    } while (uVar14 < pvVar4[uVar12].m_size);
                    uVar8 = local_f8.m_size;
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 < uVar8);
              }
              goto LAB_0013558f;
            }
            mip_level::assign(*(mip_level **)
                               (*(long *)((long)&(local_f8.m_p)->m_p + lVar11 * 2) +
                               (long)local_e0 * 8),this_00,local_94,cDefaultOrientationFlags);
            uVar14 = uVar14 + 1;
            uVar12 = (ulong)local_c0.m_faces;
            lVar11 = lVar11 + 8;
            pContext = local_90;
          } while (uVar14 < uVar12);
        }
        pvVar6 = (void *)((long)local_e0 + 1);
      } while (pvVar6 < (void *)(ulong)local_c0.m_levels);
    }
    crnd::crnd_unpack_end(pContext);
    assign(local_c8,&local_f8);
    dynamic_string::dynamic_string(&local_78,local_80);
    dynamic_string::set(&local_c8->m_name,&local_78,0xffffffff);
    if ((local_78.m_pStr != (char *)0x0) &&
       ((*(uint *)(local_78.m_pStr + -8) ^ *(uint *)(local_78.m_pStr + -4)) == 0xffffffff)) {
      crnlib_free(local_78.m_pStr + -0x10);
    }
    local_c8->m_source_file_type = cFormatCRN;
    bVar1 = true;
    dynamic_string::clear(local_88);
  }
  if (local_d8.m_p != (void *)0x0) {
    crnlib_free(local_d8.m_p);
  }
  pvVar7 = local_f8.m_p;
  if (local_f8.m_p != (vector<crnlib::mip_level_*> *)0x0) {
    uVar12 = local_f8._8_8_ & 0xffffffff;
    if (uVar12 != 0) {
      lVar11 = 0;
      do {
        pvVar6 = *(void **)((long)&pvVar7->m_p + lVar11);
        if (pvVar6 != (void *)0x0) {
          crnlib_free(pvVar6);
        }
        lVar11 = lVar11 + 0x10;
      } while (uVar12 << 4 != lVar11);
    }
    crnlib_free(local_f8.m_p);
    return bVar1;
  }
  return bVar1;
}

Assistant:

bool mipmapped_texture::read_crn_from_memory(const void* pData, uint data_size, const char* pFilename) {
  clear();

  set_last_error("Image file load failed");

  if ((!pData) || (data_size < 1))
    return false;

  crnd::crn_texture_info tex_info;
  tex_info.m_struct_size = sizeof(crnd::crn_texture_info);
  if (!crnd_get_texture_info(pData, data_size, &tex_info)) {
    set_last_error("crnd_get_texture_info() failed");
    return false;
  }

  const pixel_format dds_fmt = (pixel_format)crnd::crnd_crn_format_to_fourcc(tex_info.m_format);
  if (dds_fmt == PIXEL_FMT_INVALID) {
    set_last_error("Unsupported DXT format");
    return false;
  }

  const dxt_format dxt_fmt = pixel_format_helpers::get_dxt_format(dds_fmt);

  face_vec faces(tex_info.m_faces);
  for (uint f = 0; f < tex_info.m_faces; f++) {
    faces[f].resize(tex_info.m_levels);

    for (uint l = 0; l < tex_info.m_levels; l++)
      faces[f][l] = crnlib_new<mip_level>();
  }

  const uint tex_num_blocks_x = (tex_info.m_width + 3) >> 2;
  const uint tex_num_blocks_y = (tex_info.m_height + 3) >> 2;

  vector<uint8> dxt_data;
  // Create temp buffer big enough to hold the largest mip level, and all faces if it's a cubemap.
  dxt_data.resize(tex_info.m_bytes_per_block * tex_num_blocks_x * tex_num_blocks_y * tex_info.m_faces);

  set_last_error("CRN unpack failed");

#if 0
      timer t;
      double total_time = 0.0f;
      t.start();
#endif

  crnd::crnd_unpack_context pContext = crnd::crnd_unpack_begin(pData, data_size);

#if 0
      total_time += t.get_elapsed_secs();
#endif

  if (!pContext) {
    for (uint f = 0; f < faces.size(); f++)
      for (uint l = 0; l < faces[f].size(); l++)
        crnlib_delete(faces[f][l]);
    return false;
  }

  uint total_pixels = 0;

  void* pFaces[cCRNMaxFaces];
  for (uint f = tex_info.m_faces; f < cCRNMaxFaces; f++)
    pFaces[f] = nullptr;

  for (uint l = 0; l < tex_info.m_levels; l++) {
    const uint level_width = math::maximum<uint>(1U, tex_info.m_width >> l);
    const uint level_height = math::maximum<uint>(1U, tex_info.m_height >> l);
    const uint num_blocks_x = (level_width + 3U) >> 2U;
    const uint num_blocks_y = (level_height + 3U) >> 2U;

    const uint row_pitch = num_blocks_x * tex_info.m_bytes_per_block;
    const uint size_of_face = num_blocks_y * row_pitch;

    total_pixels += num_blocks_x * num_blocks_y * 4 * 4 * tex_info.m_faces;

#if 0
         t.start();
#endif

    for (uint f = 0; f < tex_info.m_faces; f++)
      pFaces[f] = &dxt_data[f * size_of_face];

    if (!crnd::crnd_unpack_level(pContext, pFaces, dxt_data.size(), row_pitch, l)) {
      crnd::crnd_unpack_end(pContext);
      for (uint f = 0; f < faces.size(); f++)
        for (uint l = 0; l < faces[f].size(); l++)
          crnlib_delete(faces[f][l]);
      return false;
    }

#if 0
         total_time += t.get_elapsed_secs();
#endif

    for (uint f = 0; f < tex_info.m_faces; f++) {
      dxt_image* pDXT_image = crnlib_new<dxt_image>();

      if (!pDXT_image->init(
              dxt_fmt, level_width, level_height,
              num_blocks_x * num_blocks_y * (tex_info.m_bytes_per_block / sizeof(dxt_image::element)),
              reinterpret_cast<dxt_image::element*>(pFaces[f]), true)) {
        crnlib_delete(pDXT_image);

        crnd::crnd_unpack_end(pContext);
        for (uint f = 0; f < faces.size(); f++)
          for (uint l = 0; l < faces[f].size(); l++)
            crnlib_delete(faces[f][l]);

        return false;
      }

      faces[f][l]->assign(pDXT_image, dds_fmt);
    }
  }

#if 0
      if (total_pixels)
      {
         console::info("read_crn_from_memory: Total pixels: %u, ms: %3.3fms, megapixels/sec: %3.3f",
            total_pixels, total_time * 1000.0f, total_pixels / total_time);
      }
#endif

  crnd::crnd_unpack_end(pContext);

  assign(faces);
  set_name(pFilename);

  m_source_file_type = texture_file_types::cFormatCRN;
  clear_last_error();

  return true;
}